

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918Base.hpp
# Opt level: O1

ScreenMode __thiscall
TI::TMS::Base<(TI::TMS::Personality)4>::current_screen_mode<true>
          (Base<(TI::TMS::Personality)4> *this)

{
  bool bVar1;
  
  if (this->blank_display_ != false) {
    return Blank;
  }
  if ((this->super_Storage<(TI::TMS::Personality)4,_void>).mode4_enable_ != false) {
    return SMSMode4;
  }
  bVar1 = this->mode1_enable_;
  if (bVar1 == false) {
    if ((this->mode2_enable_ == false) && (this->mode3_enable_ != true)) {
      return ColouredText;
    }
  }
  else {
    if ((this->mode2_enable_ == false) && (this->mode3_enable_ != true)) {
      return Text;
    }
    if (bVar1 != false) {
      return Blank;
    }
  }
  if ((this->mode2_enable_ == true) && (this->mode3_enable_ != true)) {
    return Graphics;
  }
  if (((bVar1 == false) && (this->mode2_enable_ == false)) && (this->mode3_enable_ != false)) {
    return MultiColour;
  }
  return Blank;
}

Assistant:

ScreenMode current_screen_mode() const {
		if(check_blank && blank_display_) {
			return ScreenMode::Blank;
		}

		if constexpr (is_sega_vdp(personality)) {
			if(Storage<personality>::mode4_enable_) {
				return ScreenMode::SMSMode4;
			}
		}

		if constexpr (is_yamaha_vdp(personality)) {
			switch(Storage<personality>::mode_) {
				case 0b00001:	return ScreenMode::Text;
				case 0b01001:	return ScreenMode::YamahaText80;
				case 0b00010:	return ScreenMode::MultiColour;
				case 0b00000:	return ScreenMode::YamahaGraphics1;
				case 0b00100:	return ScreenMode::YamahaGraphics2;
				case 0b01000:	return ScreenMode::YamahaGraphics3;
				case 0b01100:	return ScreenMode::YamahaGraphics4;
				case 0b10000:	return ScreenMode::YamahaGraphics5;
				case 0b10100:	return ScreenMode::YamahaGraphics6;
				case 0b11100:	return ScreenMode::YamahaGraphics7;
			}
		}

		if(!mode1_enable_ && !mode2_enable_ && !mode3_enable_) {
			return ScreenMode::ColouredText;
		}

		if(mode1_enable_ && !mode2_enable_ && !mode3_enable_) {
			return ScreenMode::Text;
		}

		if(!mode1_enable_ && mode2_enable_ && !mode3_enable_) {
			return ScreenMode::Graphics;
		}

		if(!mode1_enable_ && !mode2_enable_ && mode3_enable_) {
			return ScreenMode::MultiColour;
		}

		// TODO: undocumented TMS modes.
		return ScreenMode::Blank;
	}